

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  SessionHandle *data_00;
  curl_closesocket_callback p_Var1;
  _Bool _Var2;
  char *key_00;
  int rc;
  char *key;
  SessionHandle *data;
  connectbundle *new_bundle;
  connectbundle *bundle;
  connectdata *pcStack_20;
  CURLcode result;
  connectdata *conn_local;
  conncache *connc_local;
  
  data = (SessionHandle *)0x0;
  data_00 = conn->data;
  pcStack_20 = conn;
  conn_local = (connectdata *)connc;
  new_bundle = Curl_conncache_find_bundle(conn,(data_00->state).conn_cache);
  if (new_bundle == (connectbundle *)0x0) {
    bundle._4_4_ = bundle_create(data_00,(connectbundle **)&data);
    if (bundle._4_4_ != CURLE_OK) {
      return bundle._4_4_;
    }
    key_00 = hashkey(pcStack_20);
    if (key_00 == (char *)0x0) {
      bundle_destroy((connectbundle *)data);
      return CURLE_OUT_OF_MEMORY;
    }
    _Var2 = conncache_add_bundle((data_00->state).conn_cache,key_00,(connectbundle *)data);
    (*Curl_cfree)(key_00);
    if (!_Var2) {
      bundle_destroy((connectbundle *)data);
      return CURLE_OUT_OF_MEMORY;
    }
    new_bundle = (connectbundle *)data;
  }
  bundle._4_4_ = bundle_add_conn(new_bundle,pcStack_20);
  if (bundle._4_4_ == CURLE_OK) {
    p_Var1 = conn_local->fclosesocket;
    conn_local->fclosesocket = p_Var1 + 1;
    pcStack_20->connection_id = (long)p_Var1;
    (conn_local->chunk).dataleft = (conn_local->chunk).dataleft + 1;
    connc_local._4_4_ = CURLE_OK;
  }
  else {
    if (data != (SessionHandle *)0x0) {
      conncache_remove_bundle((data_00->state).conn_cache,(connectbundle *)data);
    }
    connc_local._4_4_ = bundle._4_4_;
  }
  return connc_local._4_4_;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct SessionHandle *data = conn->data;

  bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache);
  if(!bundle) {
    char *key;
    int rc;

    result = bundle_create(data, &new_bundle);
    if(result)
      return result;

    key = hashkey(conn);
    if(!key) {
      bundle_destroy(new_bundle);
      return CURLE_OUT_OF_MEMORY;
    }

    rc = conncache_add_bundle(data->state.conn_cache, key, new_bundle);
    free(key);
    if(!rc) {
      bundle_destroy(new_bundle);
      return CURLE_OUT_OF_MEMORY;
    }
    bundle = new_bundle;
  }

  result = bundle_add_conn(bundle, conn);
  if(result) {
    if(new_bundle)
      conncache_remove_bundle(data->state.conn_cache, new_bundle);
    return result;
  }

  conn->connection_id = connc->next_connection_id++;
  connc->num_connections++;

  DEBUGF(infof(conn->data, "Added connection %ld. "
               "The cache now contains %" CURL_FORMAT_CURL_OFF_TU " members\n",
               conn->connection_id, (curl_off_t) connc->num_connections));

  return CURLE_OK;
}